

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O1

void Prf_ManChainResolve(Prf_Man_t *p,clause *c)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  word *pwVar7;
  clause cVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar2 = p->iFirst;
  if (iVar2 < 0) {
    __assert_fail("p->iFirst >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xe0,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
  }
  pwVar5 = p->pInfo;
  if (pwVar5 == (word *)0x0) {
    __assert_fail("p->pInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xe1,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
  }
  cVar8 = c[(ulong)((uint)*c >> 0xb) + 1];
  if (((uint)*c & 1) == 0) {
    if (-1 < (int)cVar8) {
      pVVar6 = p->vId2Pr;
      if (pVVar6 != (Vec_Int_t *)0x0) {
        if (pVVar6->nSize <= (int)cVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        cVar8 = *(clause *)(pVVar6->pArray + (uint)cVar8);
      }
      if (-1 < (int)cVar8) {
        if (p->nWords * 0x40 <= (int)cVar8) {
          __assert_fail("Entry < 64 * p->nWords",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                        ,0xfb,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
        }
        puVar1 = (uint *)((long)pwVar5 + (ulong)((uint)cVar8 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << (cVar8._0_1_ & 0x1f);
      }
    }
  }
  else if (iVar2 <= (int)cVar8) {
    iVar3 = p->vInfo->nSize;
    uVar4 = p->nWords;
    if (iVar3 / (int)uVar4 <= (int)cVar8 - iVar2) {
      __assert_fail("clause_id(c) - p->iFirst < Prf_ManSize(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0xea,"void Prf_ManChainResolve(Prf_Man_t *, clause *)");
    }
    uVar9 = ((int)cVar8 - iVar2) * uVar4;
    if (((int)uVar9 < 0) || (iVar3 <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    if (0 < (int)uVar4) {
      pwVar7 = p->vInfo->pArray;
      uVar10 = 0;
      do {
        pwVar5[uVar10] = pwVar5[uVar10] | pwVar7[uVar9 + uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
    }
  }
  return;
}

Assistant:

static inline void Prf_ManChainResolve( Prf_Man_t * p, clause * c )
{
    assert( p->iFirst >= 0 );
    assert( p->pInfo != NULL );
    // add to proof info
    if ( c->lrn ) // learned clause
    {
        if ( clause_id(c) >= p->iFirst )
        {
            word * pProofStart;
            int w;
            assert( clause_id(c) - p->iFirst >= 0 );
            assert( clause_id(c) - p->iFirst < Prf_ManSize(p) ); 
            pProofStart = Prf_ManClauseInfo( p, clause_id(c) - p->iFirst );
            for ( w = 0; w < p->nWords; w++ )
                p->pInfo[w] |= pProofStart[w];
        }
    }
    else // problem clause
    {  
        if ( clause_id(c) >= 0 ) // has proof ID
        {
            int Entry;
            if ( p->vId2Pr == NULL )
                Entry = clause_id(c);
            else
                Entry = Vec_IntEntry( p->vId2Pr, clause_id(c) );
            if ( Entry >= 0 )
            {
                assert( Entry < 64 * p->nWords );
                Abc_InfoSetBit( (unsigned *)p->pInfo, Entry );
            }
        }
    }
}